

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TType::tensorParameterOK(TType *this,TType *right)

{
  bool bVar1;
  bool local_2a;
  bool local_29;
  TType *right_local;
  TType *this_local;
  
  bVar1 = isTensorLayoutNV(this);
  if (bVar1) {
    bVar1 = isTensorLayoutNV(right);
    local_29 = false;
    if ((bVar1) && (local_29 = false, right->typeParameters == (TTypeParameters *)0x0)) {
      local_29 = this->typeParameters != (TTypeParameters *)0x0;
    }
    this_local._7_1_ = local_29;
  }
  else {
    bVar1 = isTensorViewNV(this);
    if (bVar1) {
      bVar1 = isTensorViewNV(right);
      local_2a = false;
      if ((bVar1) && (local_2a = false, right->typeParameters == (TTypeParameters *)0x0)) {
        local_2a = this->typeParameters != (TTypeParameters *)0x0;
      }
      this_local._7_1_ = local_2a;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool tensorParameterOK(const TType& right) const
    {
        if (isTensorLayoutNV()) {
            return right.isTensorLayoutNV() && right.typeParameters == nullptr && typeParameters != nullptr;
        }
        if (isTensorViewNV()) {
            return right.isTensorViewNV() && right.typeParameters == nullptr && typeParameters != nullptr;
        }
        return false;
    }